

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strripos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int nStart;
  sxi32 rc;
  sxu32 nOfft;
  int nPatLen;
  int nLen;
  ProcStringMatch xPatternMatch;
  char *zEnd;
  char *zPtr;
  char *zPattern;
  char *zBlob;
  char *zStart;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  _nPatLen = iPatternMatch;
  zStart = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
    return 0;
  }
  zPattern = jx9_value_to_string(*apArg,(int *)&nOfft);
  zPtr = jx9_value_to_string(*(jx9_value **)(zStart + 8),&rc);
  zEnd = zPattern + (int)(nOfft - 1);
  xPatternMatch = (ProcStringMatch)(zPattern + (int)nOfft);
  zBlob = zPattern;
  nStart = 0;
  if (2 < apArg_local._4_4_) {
    iVar1 = jx9_value_to_int(*(jx9_value **)(zStart + 0x10));
    if (iVar1 < 0) {
      if ((int)nOfft <= -iVar1) {
        jx9_result_bool(pjStack_18,0);
        return 0;
      }
      nOfft = nOfft + iVar1;
      zEnd = zPattern + (int)(nOfft - 1);
      xPatternMatch = (ProcStringMatch)(zPattern + (int)nOfft);
    }
    else {
      if ((int)nOfft <= iVar1) {
        jx9_result_bool(pjStack_18,0);
        return 0;
      }
      zPattern = zPattern + iVar1;
      nOfft = nOfft - iVar1;
    }
  }
  if (((int)nOfft < 1) || (rc < 1)) {
    jx9_result_bool(pjStack_18,0);
  }
  else {
    for (; zPattern < zEnd; zEnd = zEnd + -1) {
      iVar1 = (*_nPatLen)(zEnd,(int)xPatternMatch - (int)zEnd,zPtr,rc,&nStart);
      if (iVar1 == 0) {
        jx9_result_int64(pjStack_18,(jx9_int64)(zEnd + ((ulong)(uint)nStart - (long)zBlob)));
        return 0;
      }
    }
    jx9_result_bool(pjStack_18,0);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strripos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStart, *zBlob, *zPattern, *zPtr, *zEnd;
	ProcStringMatch xPatternMatch = iPatternMatch; /* Case-insensitive pattern match */
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	/* Point to the end of the pattern */
	zPtr = &zBlob[nLen - 1];
	zEnd = &zBlob[nLen];
	/* Save the starting posistion */
	zStart = zBlob;
	nOfft = 0; /* cc warning */
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		int nStart;
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				nLen -= nStart;
				zPtr = &zBlob[nLen - 1];
				zEnd = &zBlob[nLen];
			}
		}else{
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				zBlob += nStart;
				nLen -= nStart;
			}
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		for(;;){
			if( zBlob >= zPtr ){
				break;
			}
			rc = xPatternMatch((const void *)zPtr, (sxu32)(zEnd-zPtr), (const void *)zPattern, (sxu32)nPatLen, &nOfft);
			if( rc == SXRET_OK ){
				/* Pattern found, return it's position */
				jx9_result_int64(pCtx, (jx9_int64)(&zPtr[nOfft] - zStart));
				return JX9_OK;
			}
			zPtr--;
		}
		/* Pattern not found, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}